

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O1

int file_open(char *filename,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  long lVar3;
  size_t nbytes;
  diskdriver *pdVar4;
  FILE *diskfile;
  char recbuf [2880];
  FILE *local_b70;
  undefined1 local_b68 [2880];
  
  if (file_outfile[0] == '\0') {
    *handle = -1;
    pdVar4 = handleTable;
    lVar3 = 0;
    do {
      if (pdVar4->fileptr == (FILE *)0x0) {
        *handle = (int)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
      pdVar4 = pdVar4 + 1;
    } while (lVar3 != 10000);
    if (*handle == -1) {
      iVar1 = 0x67;
    }
    else {
      iVar1 = file_openfile(filename,rwmode,(FILE **)&local_b70);
LAB_0011081d:
      iVar2 = *handle;
      handleTable[iVar2].fileptr = (FILE *)local_b70;
      handleTable[iVar2].currentpos = 0;
      handleTable[iVar2].last_io_op = 0;
    }
  }
  else {
    iVar1 = file_openfile(filename,0,(FILE **)&local_b70);
    if (iVar1 == 0) {
      iVar1 = file_create(file_outfile,handle);
      __stream = local_b70;
      if (iVar1 == 0) {
        do {
          nbytes = fread(local_b68,1,0xb40,__stream);
          if (nbytes == 0) {
            fclose(__stream);
            iVar1 = *handle;
            iVar2 = fclose((FILE *)handleTable[iVar1].fileptr);
            if (iVar2 == 0) {
              handleTable[iVar1].fileptr = (FILE *)0x0;
            }
            *handle = iVar1;
            iVar1 = file_openfile(file_outfile,rwmode,(FILE **)&local_b70);
            file_outfile[0] = '\0';
            goto LAB_0011081d;
          }
          iVar1 = file_write(*handle,local_b68,nbytes);
        } while (iVar1 == 0);
      }
      else {
        ffpmsg("Unable to create output file for copy of input file:");
        ffpmsg(file_outfile);
      }
    }
    file_outfile[0] = '\0';
  }
  return iVar1;
}

Assistant:

int file_open(char *filename, int rwmode, int *handle)
{
    FILE *diskfile;
    int copyhandle, ii, status;
    char recbuf[2880];
    size_t nread;

    /*
       if an output filename has been specified as part of the input
       file, as in "inputfile.fits(outputfile.fit)" then we have to
       create the output file, copy the input to it, then reopen the
       the new copy.
    */

    if (*file_outfile)
    {
      /* open the original file, with readonly access */
      status = file_openfile(filename, READONLY, &diskfile);
      if (status) {
        file_outfile[0] = '\0';
        return(status);
      }
      
      /* create the output file */
      status =  file_create(file_outfile,handle);
      if (status)
      {
        ffpmsg("Unable to create output file for copy of input file:");
        ffpmsg(file_outfile);
        file_outfile[0] = '\0';
        return(status);
      }

      /* copy the file from input to output */
      while(0 != (nread = fread(recbuf,1,2880, diskfile)))
      {
        status = file_write(*handle, recbuf, nread);
        if (status) {
	   file_outfile[0] = '\0';
           return(status);
        }
      }

      /* close both files */
      fclose(diskfile);
      copyhandle = *handle;
      file_close(*handle);
      *handle = copyhandle;  /* reuse the old file handle */

      /* reopen the new copy, with correct rwmode */
      status = file_openfile(file_outfile, rwmode, &diskfile);
      file_outfile[0] = '\0';
    }
    else
    {
      *handle = -1;
      for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in table */
      {
        if (handleTable[ii].fileptr == 0)
        {
            *handle = ii;
            break;
        }
      }

      if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

      /*open the file */
      status = file_openfile(filename, rwmode, &diskfile);
    }

    handleTable[*handle].fileptr = diskfile;
    handleTable[*handle].currentpos = 0;
    handleTable[*handle].last_io_op = IO_SEEK;

    return(status);
}